

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  Ref<embree::SceneGraph::MaterialNode> RVar1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  GroupNode *this_00;
  runtime_error *this_01;
  long *in_RDX;
  size_t id;
  Ref<embree::SceneGraph::MaterialNode> material;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  id = (size_t)xml[0xb].ptr;
  xml[0xb].ptr = (XML *)((long)&(((XML *)id)->super_RefCount)._vptr_RefCount + 1);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (*in_RDX + 0x30),"Mesh");
  if (bVar2) {
    loadBGFMesh((XMLLoader *)&material,xml);
    pmVar3 = std::
             map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)(xml + 0xc),&id);
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    RVar1.ptr = material.ptr;
    pmVar3->ptr = &(material.ptr)->super_Node;
    material.ptr = (MaterialNode *)0x0;
    (this->path).filename._M_dataplus._M_p = (pointer)RVar1.ptr;
    if (RVar1.ptr != (MaterialNode *)0x0) {
      (*((RVar1.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*in_RDX + 0x30),"Group");
    if (bVar2) {
      loadBGFGroupNode((XMLLoader *)&material,xml);
      pmVar3 = std::
               map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                             *)(xml + 0xc),&id);
      if (pmVar3->ptr != (Node *)0x0) {
        (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
      }
      RVar1.ptr = material.ptr;
      pmVar3->ptr = &(material.ptr)->super_Node;
      material.ptr = (MaterialNode *)0x0;
      (this->path).filename._M_dataplus._M_p = (pointer)RVar1.ptr;
      if (RVar1.ptr != (MaterialNode *)0x0) {
        (*((RVar1.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*in_RDX + 0x30),"Transform");
      if (bVar2) {
        loadBGFTransformNode((XMLLoader *)&material,xml);
        pmVar3 = std::
                 map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                               *)(xml + 0xc),&id);
        if (pmVar3->ptr != (Node *)0x0) {
          (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
        }
        RVar1.ptr = material.ptr;
        pmVar3->ptr = &(material.ptr)->super_Node;
        material.ptr = (MaterialNode *)0x0;
        (this->path).filename._M_dataplus._M_p = (pointer)RVar1.ptr;
        if (RVar1.ptr != (MaterialNode *)0x0) {
          (*((RVar1.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(*in_RDX + 0x30),"Material");
        if (bVar2) {
          loadBGFMaterial((XMLLoader *)&material,xml);
          pmVar4 = std::
                   map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                   ::operator[]((map<unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                                 *)(xml + 0x12),&id);
          if (material.ptr != (MaterialNode *)0x0) {
            (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(material.ptr);
          }
          if (pmVar4->ptr != (MaterialNode *)0x0) {
            (*(pmVar4->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          pmVar4->ptr = material.ptr;
          (this->path).filename._M_dataplus._M_p = (pointer)material.ptr;
          if (material.ptr != (MaterialNode *)0x0) {
            (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(material.ptr);
            (*((material.ptr)->super_Node).super_RefCount._vptr_RefCount[3])(material.ptr);
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(*in_RDX + 0x30),"Texture2D");
          if (!bVar2) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            ParseLocation::str_abi_cxx11_(&local_60,(ParseLocation *)(*in_RDX + 0x10));
            std::operator+(&local_40,&local_60,": unknown tag: ");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &material,&local_40,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (*in_RDX + 0x30));
            std::runtime_error::runtime_error(this_01,(string *)&material);
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          this_00 = (GroupNode *)::operator_new(0x80);
          SceneGraph::GroupNode::GroupNode(this_00,0);
          (this->path).filename._M_dataplus._M_p = (pointer)this_00;
          (**(code **)((long)(this_00->super_Node).super_RefCount._vptr_RefCount + 0x10))(this_00);
        }
      }
    }
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFNode(const Ref<XML>& xml)
  {
    //const size_t id = atoi(xml->parm("id").c_str());
    const size_t id = currentNodeID++;

    if      (xml->name == "Mesh"     ) return id2node[id] = loadBGFMesh(xml);
    else if (xml->name == "Group"    ) return id2node[id] = loadBGFGroupNode(xml);
    else if (xml->name == "Transform") return id2node[id] = loadBGFTransformNode(xml);
    else if (xml->name == "Material" ) 
    {
      Ref<SceneGraph::MaterialNode> material = loadBGFMaterial(xml); 
      id2material[id] = material;
      return material.cast<SceneGraph::Node>();
    }
    else if (xml->name == "Texture2D") {
      // textures not implemented yet
      return new SceneGraph::GroupNode();
    }
    else THROW_RUNTIME_ERROR(xml->loc.str()+": unknown tag: "+xml->name);
  }